

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNodePtr xmlNewCharRef(xmlDocPtr doc,xmlChar *name)

{
  int len;
  xmlNodePtr pxVar1;
  xmlChar *pxVar2;
  xmlRegisterNodeFunc *pp_Var3;
  
  if (name != (xmlChar *)0x0) {
    pxVar1 = (xmlNodePtr)(*xmlMalloc)(0x78);
    if (pxVar1 != (xmlNodePtr)0x0) {
      pxVar1->_private = (void *)0x0;
      *(undefined8 *)&pxVar1->type = 0;
      pxVar1->doc = (_xmlDoc *)0x0;
      pxVar1->ns = (xmlNs *)0x0;
      pxVar1->nsDef = (xmlNs *)0x0;
      pxVar1->psvi = (void *)0x0;
      pxVar1->content = (xmlChar *)0x0;
      pxVar1->properties = (_xmlAttr *)0x0;
      pxVar1->next = (_xmlNode *)0x0;
      pxVar1->prev = (_xmlNode *)0x0;
      pxVar1->last = (_xmlNode *)0x0;
      pxVar1->parent = (_xmlNode *)0x0;
      pxVar1->name = (xmlChar *)0x0;
      pxVar1->children = (_xmlNode *)0x0;
      pxVar1->line = 0;
      pxVar1->extra = 0;
      *(undefined4 *)&pxVar1->field_0x74 = 0;
      pxVar1->type = XML_ENTITY_REF_NODE;
      pxVar1->doc = doc;
      if (*name == '&') {
        len = xmlStrlen(name + 1);
        if (name[len] == ';') {
          len = len + -1;
        }
        pxVar2 = xmlStrndup(name + 1,len);
      }
      else {
        pxVar2 = xmlStrdup(name);
      }
      pxVar1->name = pxVar2;
      if (__xmlRegisterCallbacks == 0) {
        return pxVar1;
      }
      pp_Var3 = __xmlRegisterNodeDefaultValue();
      if (*pp_Var3 == (xmlRegisterNodeFunc)0x0) {
        return pxVar1;
      }
      pp_Var3 = __xmlRegisterNodeDefaultValue();
      (**pp_Var3)(pxVar1);
      return pxVar1;
    }
    xmlTreeErrMemory("building character reference");
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlNewCharRef(xmlDocPtr doc, const xmlChar *name) {
    xmlNodePtr cur;

    if (name == NULL)
        return(NULL);

    /*
     * Allocate a new node and fill the fields.
     */
    cur = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (cur == NULL) {
	xmlTreeErrMemory("building character reference");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlNode));
    cur->type = XML_ENTITY_REF_NODE;

    cur->doc = doc;
    if (name[0] == '&') {
        int len;
        name++;
	len = xmlStrlen(name);
	if (name[len - 1] == ';')
	    cur->name = xmlStrndup(name, len - 1);
	else
	    cur->name = xmlStrndup(name, len);
    } else
	cur->name = xmlStrdup(name);

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue(cur);
    return(cur);
}